

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O1

bool icu_63::number::impl::AffixUtils::containsType
               (UnicodeString *affixPattern,AffixPatternType type,UErrorCode *status)

{
  short sVar1;
  AffixTag AVar2;
  bool bVar3;
  AffixUtils *this;
  int iVar4;
  UErrorCode *in_R8;
  AffixTag tag;
  AffixTag local_38;
  
  AVar2 = local_38;
  sVar1 = (affixPattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (affixPattern->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  bVar3 = false;
  if (iVar4 != 0) {
    local_38._0_8_ = local_38._4_8_ << 0x20;
    local_38.type = AVar2.type;
    local_38.state = STATE_BASE;
    this = (AffixUtils *)local_38._0_8_;
    do {
      bVar3 = hasNext(&local_38,affixPattern);
      AVar2 = local_38;
      if (!bVar3) {
        return false;
      }
      tag._8_8_ = affixPattern;
      tag.offset = local_38.state;
      tag.codePoint = local_38.type;
      local_38 = AVar2;
      local_38 = nextToken(this,tag,(UnicodeString *)status,in_R8);
      this = local_38._0_8_;
      if (U_ZERO_ERROR < *status) {
        return false;
      }
    } while (local_38.type != type);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
AffixUtils::containsType(const UnicodeString &affixPattern, AffixPatternType type, UErrorCode &status) {
    if (affixPattern.length() == 0) {
        return false;
    }
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return false; }
        if (tag.type == type) {
            return true;
        }
    }
    return false;
}